

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::RenderDeviceVkImpl::SubmitCommandBuffer
          (RenderDeviceVkImpl *this,SoftwareQueueIndex CommandQueueId,VkSubmitInfo *SubmitInfo,
          Uint64 *SubmittedCmdBuffNumber,Uint64 *SubmittedFenceValue,
          vector<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
          *pSignalFences)

{
  CommandQueue *pCVar1;
  IFence Value;
  FenceVkImpl *this_00;
  bool bVar2;
  Uint32 UVar3;
  SubmittedCommandBufferInfo SVar4;
  shared_ptr<Diligent::SyncPointVk> local_b0;
  SoftwareQueueIndex local_9d;
  FenceVkImpl *local_90;
  FenceVkImpl *pFenceVkImpl;
  pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_> *val_fence;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
  *__range2;
  SyncPointVkPtr pSyncPoint;
  CommandQueueVkImpl *pQueue;
  VkQueue local_48;
  SubmittedCommandBufferInfo CmbBuffInfo;
  vector<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
  *pSignalFences_local;
  Uint64 *SubmittedFenceValue_local;
  Uint64 *SubmittedCmdBuffNumber_local;
  VkSubmitInfo *SubmitInfo_local;
  RenderDeviceVkImpl *this_local;
  SoftwareQueueIndex CommandQueueId_local;
  
  this_local._7_1_ = CommandQueueId.m_Value;
  SVar4 = RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
          ::SubmitCommandBuffer<VkSubmitInfo>
                    (&this->
                      super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                     ,CommandQueueId,true,SubmitInfo);
  CmbBuffInfo.CmdBufferNumber = SVar4.FenceValue;
  *SubmittedFenceValue = CmbBuffInfo.CmdBufferNumber;
  local_48 = (VkQueue)SVar4.CmdBufferNumber;
  *SubmittedCmdBuffNumber = (Uint64)local_48;
  if (pSignalFences !=
      (vector<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
       *)0x0) {
    bVar2 = std::
            vector<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
            ::empty(pSignalFences);
    if (!bVar2) {
      pCVar1 = (this->
               super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
               ).m_CommandQueues;
      UVar3 = IndexWrapper::operator_cast_to_unsigned_int((IndexWrapper *)((long)&this_local + 7));
      pSyncPoint.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              RefCntAutoPtr<Diligent::ICommandQueueVk>::RawPtr<Diligent::CommandQueueVkImpl>
                        (&pCVar1[UVar3].CmdQueue);
      CommandQueueVkImpl::GetLastSyncPoint((CommandQueueVkImpl *)&__range2);
      __end2 = std::
               vector<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
               ::begin(pSignalFences);
      val_fence = (pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_> *)
                  std::
                  vector<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
                  ::end(pSignalFences);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          (&__end2,(__normal_iterator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_*,_std::vector<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>_>
                                    *)&val_fence);
        if (!bVar2) break;
        pFenceVkImpl = (FenceVkImpl *)
                       __gnu_cxx::
                       __normal_iterator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_*,_std::vector<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>_>
                       ::operator*(&__end2);
        local_90 = Diligent::RefCntAutoPtr::operator_cast_to_FenceVkImpl_
                             ((RefCntAutoPtr *)
                              &(pFenceVkImpl->super_FenceBase<Diligent::EngineVkImplTraits>).
                               super_DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>
                               .super_ObjectBase<Diligent::IFenceVk>.
                               super_RefCountedObject<Diligent::IFenceVk>.m_pRefCounters);
        bVar2 = FenceVkImpl::IsTimelineSemaphore(local_90);
        this_00 = local_90;
        if (!bVar2) {
          local_9d.m_Value = this_local._7_1_;
          Value.super_IDeviceObject.super_IObject._vptr_IObject =
               (pFenceVkImpl->super_FenceBase<Diligent::EngineVkImplTraits>).
               super_DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>
               .super_ObjectBase<Diligent::IFenceVk>.super_RefCountedObject<Diligent::IFenceVk>.
               super_IFenceVk.super_IFence.super_IDeviceObject;
          std::shared_ptr<Diligent::SyncPointVk>::shared_ptr
                    (&local_b0,(shared_ptr<Diligent::SyncPointVk> *)&__range2);
          FenceVkImpl::AddPendingSyncPoint
                    (this_00,local_9d,(Uint64)Value.super_IDeviceObject.super_IObject._vptr_IObject,
                     &local_b0);
          std::shared_ptr<Diligent::SyncPointVk>::~shared_ptr(&local_b0);
        }
        __gnu_cxx::
        __normal_iterator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_*,_std::vector<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>_>
        ::operator++(&__end2);
      }
      std::shared_ptr<Diligent::SyncPointVk>::~shared_ptr
                ((shared_ptr<Diligent::SyncPointVk> *)&__range2);
    }
  }
  return;
}

Assistant:

void RenderDeviceVkImpl::SubmitCommandBuffer(SoftwareQueueIndex                                          CommandQueueId,
                                             const VkSubmitInfo&                                         SubmitInfo,
                                             Uint64&                                                     SubmittedCmdBuffNumber, // Number of the submitted command buffer
                                             Uint64&                                                     SubmittedFenceValue,    // Fence value associated with the submitted command buffer
                                             std::vector<std::pair<Uint64, RefCntAutoPtr<FenceVkImpl>>>* pSignalFences           // List of fences to signal
)
{
    // Submit the command list to the queue
    SubmittedCommandBufferInfo CmbBuffInfo = TRenderDeviceBase::SubmitCommandBuffer(CommandQueueId, true, SubmitInfo);
    SubmittedFenceValue                    = CmbBuffInfo.FenceValue;
    SubmittedCmdBuffNumber                 = CmbBuffInfo.CmdBufferNumber;

    if (pSignalFences != nullptr && !pSignalFences->empty())
    {
        CommandQueueVkImpl* pQueue     = m_CommandQueues[CommandQueueId].CmdQueue.RawPtr<CommandQueueVkImpl>();
        SyncPointVkPtr      pSyncPoint = pQueue->GetLastSyncPoint();

        for (auto& val_fence : *pSignalFences)
        {
            FenceVkImpl* pFenceVkImpl = val_fence.second;
            if (!pFenceVkImpl->IsTimelineSemaphore())
                pFenceVkImpl->AddPendingSyncPoint(CommandQueueId, val_fence.first, pSyncPoint);
        }
    }
}